

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::Generate
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  mapped_type *pmVar7;
  string *psVar8;
  MessageOptions *this_00;
  EnumDescriptor *descriptor;
  Descriptor *pDVar9;
  OneofDescriptor *pOVar10;
  OneofGeneratorInfo *pOVar11;
  FieldDescriptor *pFVar12;
  ImmutableFieldGenerator *pIVar13;
  int __c;
  int i_00;
  int i_01;
  int i_02;
  int i_03;
  Descriptor *descriptor_00;
  ulong uVar14;
  ulong extraout_RDX;
  FieldDescriptor *field_00;
  SubstituteArg *in_stack_fffffffffffff318;
  ImmutableExtensionGenerator local_9d8;
  int local_994;
  undefined1 local_990 [4];
  int i_6;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  int local_8d0;
  allocator<char> local_8c9;
  int i_5;
  string local_8a8;
  string local_888;
  string local_868;
  FieldDescriptor *local_848;
  FieldDescriptor *field_1;
  int j_1;
  string local_818;
  string local_7f8;
  string local_7d8;
  FieldDescriptor *local_7b8;
  FieldDescriptor *field;
  int j;
  string local_788;
  allocator<char> local_761;
  key_type local_760;
  allocator<char> local_739;
  key_type local_738;
  uint local_714;
  undefined1 local_710 [4];
  int i_4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  uint local_6c0;
  int i_3;
  int totalInts;
  int i_2;
  int totalBits;
  ImmutableMessageGenerator messageGenerator;
  undefined1 local_668 [4];
  int i_1;
  int local_614;
  undefined1 local_610 [4];
  int i;
  SubstituteArg local_5e0;
  SubstituteArg local_5b0;
  SubstituteArg local_580;
  SubstituteArg local_550;
  SubstituteArg local_520;
  SubstituteArg local_4f0;
  SubstituteArg local_4c0;
  SubstituteArg local_490;
  string local_460;
  SubstituteArg local_440;
  string local_410;
  SubstituteArg local_3f0;
  SubstituteArg local_3c0;
  SubstituteArg local_390;
  SubstituteArg local_360;
  SubstituteArg local_330;
  SubstituteArg local_300;
  SubstituteArg local_2d0;
  SubstituteArg local_2a0;
  string local_270;
  SubstituteArg local_250;
  string local_220;
  SubstituteArg local_200;
  string local_1d0;
  undefined1 local_1b0 [8];
  string builder_type;
  string local_188;
  allocator<char> local_161;
  key_type local_160;
  allocator<char> local_139;
  key_type local_138;
  string local_118 [39];
  allocator<char> local_f1;
  key_type local_f0;
  string local_d0;
  allocator<char> local_a9;
  key_type local_a8;
  allocator<char> local_71;
  key_type local_70;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  bool is_own_file;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  variables._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
       IsOwnFile<google::protobuf::Descriptor>((this->super_MessageGenerator).descriptor_,true);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  pcVar6 = " static ";
  if ((variables._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
    pcVar6 = " ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"static",&local_71);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_70);
  std::__cxx11::string::operator=((string *)pmVar7,pcVar6);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  psVar8 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"classname",&local_a9);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_a8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)psVar8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  ExtraMessageInterfaces_abi_cxx11_
            (&local_d0,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"extra_interfaces",&local_f1);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_f0);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_d0);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"ver",&local_139);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_138);
  std::__cxx11::string::operator=((string *)pmVar7,local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string(local_118);
  this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
  bVar2 = MessageOptions::deprecated(this_00);
  pcVar6 = "";
  if (bVar2) {
    pcVar6 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"deprecation",&local_161);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_160);
  std::__cxx11::string::operator=((string *)pmVar7,pcVar6);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  WriteMessageDocComment(printer,(this->super_MessageGenerator).descriptor_);
  pDVar9 = (this->super_MessageGenerator).descriptor_;
  pCVar1 = this->context_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"",(allocator<char> *)(builder_type.field_2._M_local_buf + 0xf));
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (pCVar1,printer,pDVar9,true,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)(builder_type.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_1b0);
  iVar3 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  if (iVar3 < 1) {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "$deprecation$public $static$final class $classname$ extends\n");
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,"classname",(this->super_MessageGenerator).descriptor_);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "    com.google.protobuf.GeneratedMessage$ver$ implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    GeneratedCodeVersionSuffix_abi_cxx11_();
    strings::internal::SubstituteArg::SubstituteArg(&local_440,&local_460);
    strings::internal::SubstituteArg::SubstituteArg(&local_490);
    strings::internal::SubstituteArg::SubstituteArg(&local_4c0);
    strings::internal::SubstituteArg::SubstituteArg(&local_4f0);
    strings::internal::SubstituteArg::SubstituteArg(&local_520);
    strings::internal::SubstituteArg::SubstituteArg(&local_550);
    strings::internal::SubstituteArg::SubstituteArg(&local_580);
    strings::internal::SubstituteArg::SubstituteArg(&local_5b0);
    strings::internal::SubstituteArg::SubstituteArg(&local_5e0);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_610);
    strings::Substitute_abi_cxx11_
              (&local_410,(strings *)"com.google.protobuf.GeneratedMessage$0.Builder<?>",
               (char *)&local_440,&local_490,&local_4c0,&local_4f0,&local_520,&local_550,&local_580,
               &local_5b0,&local_5e0,(SubstituteArg *)local_610,in_stack_fffffffffffff318);
    std::__cxx11::string::operator=((string *)local_1b0,(string *)&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_460);
  }
  else {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "$deprecation$public $static$final class $classname$ extends\n");
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,"classname",(this->super_MessageGenerator).descriptor_);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n      $classname$> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_220,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
    strings::internal::SubstituteArg::SubstituteArg(&local_200,&local_220);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    strings::internal::SubstituteArg::SubstituteArg(&local_250,&local_270);
    strings::internal::SubstituteArg::SubstituteArg(&local_2a0);
    strings::internal::SubstituteArg::SubstituteArg(&local_2d0);
    strings::internal::SubstituteArg::SubstituteArg(&local_300);
    strings::internal::SubstituteArg::SubstituteArg(&local_330);
    strings::internal::SubstituteArg::SubstituteArg(&local_360);
    strings::internal::SubstituteArg::SubstituteArg(&local_390);
    strings::internal::SubstituteArg::SubstituteArg(&local_3c0);
    strings::internal::SubstituteArg::SubstituteArg(&local_3f0);
    strings::Substitute_abi_cxx11_
              (&local_1d0,
               (strings *)"com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
               (char *)&local_200,&local_250,&local_2a0,&local_2d0,&local_300,&local_330,&local_360,
               &local_390,&local_3c0,&local_3f0,in_stack_fffffffffffff318);
    std::__cxx11::string::operator=((string *)local_1b0,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_220);
  }
  io::Printer::Indent(printer);
  psVar8 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n}\n"
                     ,"classname",psVar8,"buildertype",(string *)local_1b0);
  psVar8 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,"private $classname$() {\n","classname",psVar8);
  io::Printer::Indent(printer);
  GenerateInitializers(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  io::Printer::Print(printer,
                     "@java.lang.Override\npublic final com.google.protobuf.UnknownFieldSet\ngetUnknownFields() {\n"
                    );
  bVar2 = PreserveUnknownFields((this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    io::Printer::Print(printer,"  return this.unknownFields;\n");
  }
  else {
    io::Printer::Print(printer,
                       "  return com.google.protobuf.UnknownFieldSet.getDefaultInstance();\n");
  }
  io::Printer::Print(printer,"}\n");
  bVar2 = Context::HasGeneratedMethods(this->context_,(this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    GenerateParsingConstructor(this,printer);
  }
  GenerateDescriptorMethods(this,printer);
  for (local_614 = 0; iVar3 = local_614,
      iVar4 = Descriptor::enum_type_count((this->super_MessageGenerator).descriptor_), iVar3 < iVar4
      ; local_614 = local_614 + 1) {
    descriptor = Descriptor::enum_type((this->super_MessageGenerator).descriptor_,local_614);
    EnumGenerator::EnumGenerator((EnumGenerator *)local_668,descriptor,true,this->context_);
    EnumGenerator::Generate((EnumGenerator *)local_668,printer);
    EnumGenerator::~EnumGenerator((EnumGenerator *)local_668);
  }
  for (messageGenerator.field_generators_.field_generators_.array_._4_4_ = 0;
      iVar3 = messageGenerator.field_generators_.field_generators_.array_._4_4_,
      iVar4 = Descriptor::nested_type_count((this->super_MessageGenerator).descriptor_),
      iVar3 < iVar4;
      messageGenerator.field_generators_.field_generators_.array_._4_4_ =
           messageGenerator.field_generators_.field_generators_.array_._4_4_ + 1) {
    pDVar9 = Descriptor::nested_type
                       ((this->super_MessageGenerator).descriptor_,
                        messageGenerator.field_generators_.field_generators_.array_._4_4_);
    bVar2 = IsMapEntry(pDVar9);
    if (!bVar2) {
      pDVar9 = Descriptor::nested_type
                         ((this->super_MessageGenerator).descriptor_,
                          messageGenerator.field_generators_.field_generators_.array_._4_4_);
      ImmutableMessageGenerator((ImmutableMessageGenerator *)&i_2,pDVar9,this->context_);
      GenerateInterface((ImmutableMessageGenerator *)&i_2,printer);
      Generate((ImmutableMessageGenerator *)&i_2,printer);
      ~ImmutableMessageGenerator((ImmutableMessageGenerator *)&i_2);
    }
  }
  bVar2 = anon_unknown_15::GenerateHasBits((this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    totalInts = 0;
    for (i_3 = 0; iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_),
        i_3 < iVar3; i_3 = i_3 + 1) {
      pFVar12 = Descriptor::field((this->super_MessageGenerator).descriptor_,i_3);
      pIVar13 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                          (&this->field_generators_,pFVar12);
      iVar3 = (*pIVar13->_vptr_ImmutableFieldGenerator[2])();
      totalInts = iVar3 + totalInts;
    }
    uVar14 = (long)(totalInts + 0x1f) % 0x20 & 0xffffffff;
    for (local_6c0 = 0; (int)local_6c0 < (totalInts + 0x1f) / 0x20; local_6c0 = local_6c0 + 1) {
      GetBitFieldName_abi_cxx11_
                ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (java *)(ulong)local_6c0,(int)uVar14);
      io::Printer::Print(printer,"private int $bit_field_name$;\n","bit_field_name",
                         (string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string
                ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      uVar14 = extraout_RDX;
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_710);
  for (local_714 = 0; uVar5 = local_714,
      iVar3 = Descriptor::oneof_decl_count((this->super_MessageGenerator).descriptor_),
      (int)uVar5 < iVar3; local_714 = local_714 + 1) {
    pCVar1 = this->context_;
    pOVar10 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_714);
    pOVar11 = Context::GetOneofGeneratorInfo(pCVar1,pOVar10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"oneof_name",&local_739)
    ;
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_710,&local_738);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)pOVar11);
    std::__cxx11::string::~string((string *)&local_738);
    std::allocator<char>::~allocator(&local_739);
    pCVar1 = this->context_;
    pOVar10 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_714);
    pOVar11 = Context::GetOneofGeneratorInfo(pCVar1,pOVar10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_760,"oneof_capitalized_name",&local_761);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_710,&local_760);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&pOVar11->capitalized_name);
    std::__cxx11::string::~string((string *)&local_760);
    std::allocator<char>::~allocator(&local_761);
    pcVar6 = (char *)(ulong)local_714;
    pOVar10 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_714);
    pcVar6 = OneofDescriptor::index(pOVar10,pcVar6,__c);
    SimpleItoa_abi_cxx11_(&local_788,(protobuf *)((ulong)pcVar6 & 0xffffffff),i_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&j,"oneof_index",(allocator<char> *)((long)&field + 7));
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_710,(key_type *)&j);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_788);
    std::__cxx11::string::~string((string *)&j);
    std::allocator<char>::~allocator((allocator<char> *)((long)&field + 7));
    std::__cxx11::string::~string((string *)&local_788);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_710,
                       "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                      );
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_710,
                       "public enum $oneof_capitalized_name$Case\n    implements com.google.protobuf.Internal.EnumLite {\n"
                      );
    io::Printer::Indent(printer);
    field._0_4_ = 0;
    while( true ) {
      iVar3 = (int)field;
      pOVar10 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_714);
      iVar4 = OneofDescriptor::field_count(pOVar10);
      if (iVar4 <= iVar3) break;
      pOVar10 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_714);
      local_7b8 = OneofDescriptor::field(pOVar10,(int)field);
      psVar8 = FieldDescriptor::name_abi_cxx11_(local_7b8);
      ToUpper(&local_7d8,psVar8);
      uVar5 = FieldDescriptor::number(local_7b8);
      SimpleItoa_abi_cxx11_(&local_7f8,(protobuf *)(ulong)uVar5,i_01);
      io::Printer::Print(printer,"$field_name$($field_number$),\n","field_name",&local_7d8,
                         "field_number",&local_7f8);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_7d8);
      field._0_4_ = (int)field + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&j_1,"oneof_name",(allocator<char> *)((long)&field_1 + 7));
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_710,(key_type *)&j_1);
    ToUpper(&local_818,pmVar7);
    io::Printer::Print(printer,"$cap_oneof_name$_NOT_SET(0);\n","cap_oneof_name",&local_818);
    std::__cxx11::string::~string((string *)&local_818);
    std::__cxx11::string::~string((string *)&j_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&field_1 + 7));
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_710,
                       "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
                      );
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_710,
                       "/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n"
                      );
    field_1._0_4_ = 0;
    while( true ) {
      iVar3 = (int)field_1;
      pOVar10 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_714);
      iVar4 = OneofDescriptor::field_count(pOVar10);
      if (iVar4 <= iVar3) break;
      pOVar10 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,local_714);
      local_848 = OneofDescriptor::field(pOVar10,(int)field_1);
      uVar5 = FieldDescriptor::number(local_848);
      SimpleItoa_abi_cxx11_(&local_868,(protobuf *)(ulong)uVar5,i_02);
      psVar8 = FieldDescriptor::name_abi_cxx11_(local_848);
      ToUpper(&local_888,psVar8);
      io::Printer::Print(printer,"    case $field_number$: return $field_name$;\n","field_number",
                         &local_868,"field_name",&local_888);
      std::__cxx11::string::~string((string *)&local_888);
      std::__cxx11::string::~string((string *)&local_868);
      field_1._0_4_ = (int)field_1 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&i_5,"oneof_name",&local_8c9);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_710,(key_type *)&i_5);
    ToUpper(&local_8a8,pmVar7);
    io::Printer::Print(printer,
                       "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
                       ,"cap_oneof_name",&local_8a8);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::__cxx11::string::~string((string *)&i_5);
    std::allocator<char>::~allocator(&local_8c9);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"};\n\n");
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_710,
                       "public $oneof_capitalized_name$Case\nget$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\n"
                      );
  }
  bVar2 = IsAnyMessage((this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    GenerateAnyMethods(this,printer);
  }
  for (local_8d0 = 0; iVar3 = local_8d0,
      iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar3 < iVar4;
      local_8d0 = local_8d0 + 1) {
    pFVar12 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_8d0);
    FieldConstantName_abi_cxx11_(&local_8f0,(java *)pFVar12,field_00);
    pFVar12 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_8d0);
    uVar5 = FieldDescriptor::number(pFVar12);
    SimpleItoa_abi_cxx11_(&local_910,(protobuf *)(ulong)uVar5,i_03);
    io::Printer::Print(printer,"public static final int $constant_name$ = $number$;\n",
                       "constant_name",&local_8f0,"number",&local_910);
    std::__cxx11::string::~string((string *)&local_910);
    std::__cxx11::string::~string((string *)&local_8f0);
    pFVar12 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_8d0);
    pIVar13 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                        (&this->field_generators_,pFVar12);
    (*pIVar13->_vptr_ImmutableFieldGenerator[5])(pIVar13,printer);
    io::Printer::Print(printer,"\n");
  }
  bVar2 = Context::HasGeneratedMethods(this->context_,(this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    GenerateIsInitialized(this,printer);
    GenerateMessageSerializationMethods(this,printer);
    GenerateEqualsAndHashCode(this,printer);
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  psVar8 = Descriptor::full_name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n","full_name",
                     psVar8);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_930,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,"private static final $classname$ DEFAULT_INSTANCE;\n","classname",
                     &local_930);
  std::__cxx11::string::~string((string *)&local_930);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_950,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,"static {\n  DEFAULT_INSTANCE = new $classname$();\n}\n\n","classname",
                     &local_950);
  std::__cxx11::string::~string((string *)&local_950);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_970,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n"
                     ,"classname",&local_970);
  std::__cxx11::string::~string((string *)&local_970);
  GenerateParser(this,printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)local_990,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "public $classname$ getDefaultInstanceForType() {\n  return DEFAULT_INSTANCE;\n}\n\n"
                     ,"classname",(string *)local_990);
  std::__cxx11::string::~string((string *)local_990);
  for (local_994 = 0; iVar3 = local_994,
      iVar4 = Descriptor::extension_count((this->super_MessageGenerator).descriptor_), iVar3 < iVar4
      ; local_994 = local_994 + 1) {
    pFVar12 = Descriptor::extension((this->super_MessageGenerator).descriptor_,local_994);
    ImmutableExtensionGenerator::ImmutableExtensionGenerator(&local_9d8,pFVar12,this->context_);
    ImmutableExtensionGenerator::Generate(&local_9d8,printer);
    ImmutableExtensionGenerator::~ImmutableExtensionGenerator(&local_9d8);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_710);
  std::__cxx11::string::~string((string *)local_1b0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_50);
  return;
}

Assistant:

void ImmutableMessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<string, string> variables;
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["ver"] = GeneratedCodeVersionSuffix();
  variables["deprecation"] = descriptor_->options().deprecated()
      ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);

  // The builder_type stores the super type name of the nested Builder class.
  string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(
        variables,
        "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n"
        "      $classname$> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_),
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(variables,
      "    com.google.protobuf.GeneratedMessage$ver$ implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessage$0.Builder<?>",
        GeneratedCodeVersionSuffix());
  }
  printer->Indent();
  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
    "// Use $classname$.newBuilder() to construct.\n"
    "private $classname$($buildertype$ builder) {\n"
    "  super(builder);\n"
    "}\n",
    "classname", descriptor_->name(),
    "buildertype", builder_type);
  printer->Print(
    "private $classname$() {\n",
    "classname", descriptor_->name());
  printer->Indent();
  GenerateInitializers(printer);
  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");

  printer->Print(
    "@java.lang.Override\n"
    "public final com.google.protobuf.UnknownFieldSet\n"
    "getUnknownFields() {\n");
  if (PreserveUnknownFields(descriptor_)) {
    printer->Print(
      "  return this.unknownFields;\n");
  } else {
    printer->Print(
      "  return com.google.protobuf.UnknownFieldSet.getDefaultInstance();\n");
  }
  printer->Print(
    "}\n");

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateParsingConstructor(printer);
  }

  GenerateDescriptorMethods(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator messageGenerator(
        descriptor_->nested_type(i), context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  if (GenerateHasBits(descriptor_)) {
    // Integers for bit fields.
    int totalBits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      totalBits += field_generators_.get(descriptor_->field(i))
          .GetNumBitsForMessage();
    }
    int totalInts = (totalBits + 31) / 32;
    for (int i = 0; i < totalInts; i++) {
      printer->Print("private int $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  // oneof
  std::map<string, string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(
        descriptor_->oneof_decl(i))->name;
    vars["oneof_capitalized_name"] = context_->GetOneofGeneratorInfo(
        descriptor_->oneof_decl(i))->capitalized_name;
    vars["oneof_index"] = SimpleItoa(descriptor_->oneof_decl(i)->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
      "private int $oneof_name$Case_ = 0;\n"
      "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(vars,
      "public enum $oneof_capitalized_name$Case\n"
      "    implements com.google.protobuf.Internal.EnumLite {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "$field_name$($field_number$),\n",
        "field_name",
        ToUpper(field->name()),
        "field_number",
        SimpleItoa(field->number()));
    }
    printer->Print(
      "$cap_oneof_name$_NOT_SET(0);\n",
      "cap_oneof_name",
      ToUpper(vars["oneof_name"]));
    printer->Print(vars,
      "private final int value;\n"
      "private $oneof_capitalized_name$Case(int value) {\n"
      "  this.value = value;\n"
      "}\n");
    printer->Print(vars,
      "/**\n"
      " * @deprecated Use {@link #forNumber(int)} instead.\n"
      " */\n"
      "@java.lang.Deprecated\n"
      "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
      "  return forNumber(value);\n"
      "}\n"
      "\n"
      "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
      "  switch (value) {\n");
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "    case $field_number$: return $field_name$;\n",
        "field_number",
        SimpleItoa(field->number()),
        "field_name",
        ToUpper(field->name()));
    }
    printer->Print(
      "    case 0: return $cap_oneof_name$_NOT_SET;\n"
      "    default: return null;\n"
      "  }\n"
      "}\n"
      "public int getNumber() {\n"
      "  return this.value;\n"
      "}\n",
      "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
      "public $oneof_capitalized_name$Case\n"
      "get$oneof_capitalized_name$Case() {\n"
      "  return $oneof_capitalized_name$Case.forNumber(\n"
      "      $oneof_name$Case_);\n"
      "}\n"
      "\n");
  }

  if (IsAnyMessage(descriptor_)) {
    GenerateAnyMethods(printer);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
      "constant_name", FieldConstantName(descriptor_->field(i)),
      "number", SimpleItoa(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateMessageSerializationMethods(printer);
    GenerateEqualsAndHashCode(printer);
  }


  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());


  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print(
    "private static final $classname$ DEFAULT_INSTANCE;\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));
  printer->Print(
    "static {\n"
    "  DEFAULT_INSTANCE = new $classname$();\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  GenerateParser(printer);

  printer->Print(
    "public $classname$ getDefaultInstanceForType() {\n"
    "  return DEFAULT_INSTANCE;\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}